

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::detail::rawMemoryToString(String *__return_storage_ptr__,void *object,uint size)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  
  poVar1 = tlssPush();
  poVar2 = std::operator<<(poVar1,"0x");
  poVar2 = std::operator<<(poVar2,0x30);
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  lVar3 = (long)(int)size;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostream*        oss   = tlssPush();
        *oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            *oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return tlssPop();
    }